

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_schnorr.cpp
# Opt level: O2

SecretDataStruct *
cfd::js::api::json::SchnorrApi::ExtractSecretEcdsaAdaptor
          (SecretDataStruct *__return_storage_ptr__,ExtractSecretEcdsaAdaptorRequestStruct *request)

{
  string *in_R8;
  allocator local_119;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  function<cfd::js::api::SecretDataStruct_(const_cfd::js::api::ExtractSecretEcdsaAdaptorRequestStruct_&)>
  local_f8;
  SecretDataStruct local_d8;
  
  SecretDataStruct::SecretDataStruct(__return_storage_ptr__);
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_100 = std::
              _Function_handler<cfd::js::api::SecretDataStruct_(const_cfd::js::api::ExtractSecretEcdsaAdaptorRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_schnorr.cpp:307:20)>
              ::_M_invoke;
  local_108 = std::
              _Function_handler<cfd::js::api::SecretDataStruct_(const_cfd::js::api::ExtractSecretEcdsaAdaptorRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_schnorr.cpp:307:20)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_f8,"ExtractSecretEcdsaAdaptor",&local_119);
  ExecuteStructApi<cfd::js::api::ExtractSecretEcdsaAdaptorRequestStruct,cfd::js::api::SecretDataStruct>
            (&local_d8,(api *)request,(ExtractSecretEcdsaAdaptorRequestStruct *)&local_118,&local_f8
             ,in_R8);
  SecretDataStruct::operator=(__return_storage_ptr__,&local_d8);
  SecretDataStruct::~SecretDataStruct(&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_118);
  return __return_storage_ptr__;
}

Assistant:

SecretDataStruct SchnorrApi::ExtractSecretEcdsaAdaptor(
    const ExtractSecretEcdsaAdaptorRequestStruct& request) {
  auto call_func = [](const ExtractSecretEcdsaAdaptorRequestStruct& request)
      -> SecretDataStruct {
    SecretDataStruct response;

    Pubkey adaptor(request.adaptor);
    AdaptorSignature adaptor_signature(request.adaptor_signature);
    ByteData signature(request.signature);

    auto secret =
        AdaptorUtil::ExtractSecret(adaptor_signature, signature, adaptor);
    response.secret = secret.GetHex();
    return response;
  };

  SecretDataStruct result;
  result = ExecuteStructApi<
      ExtractSecretEcdsaAdaptorRequestStruct, SecretDataStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}